

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAddCollateString(Parse *pParse,Expr *pExpr,char *zC)

{
  uint uVar1;
  size_t sVar2;
  Expr *pEVar3;
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._0_8_ = zC;
  if (zC == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    sVar2 = strlen(zC);
    uVar1 = (uint)sVar2 & 0x3fffffff;
  }
  local_28._8_4_ = uVar1;
  pEVar3 = sqlite3ExprAddCollateToken(pParse,pExpr,(Token *)local_28,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pEVar3;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateString(
  const Parse *pParse,  /* Parsing context */
  Expr *pExpr,          /* Add the "COLLATE" clause to this expression */
  const char *zC        /* The collating sequence name */
){
  Token s;
  assert( zC!=0 );
  sqlite3TokenInit(&s, (char*)zC);
  return sqlite3ExprAddCollateToken(pParse, pExpr, &s, 0);
}